

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall
UKF::SigmaPointPrediction(UKF *this,double delta_t,MatrixXd *Xsig_aug,MatrixXd *Xsig_pred)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  int i;
  long col;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_d8;
  double dStack_d0;
  double local_88;
  
  for (col = 0; col < this->n_sigma_; col = col + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,0,
                        col);
    dStack_d0 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,1,
                        col);
    local_d8 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,2,
                        col);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,3,
                        col);
    dVar10 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,4,
                        col);
    dVar2 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,5,
                        col);
    dVar3 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Xsig_aug,6,
                        col);
    dVar4 = *pdVar5;
    if (ABS(dVar2) <= 0.001) {
      dVar7 = cos(dVar10);
      dVar9 = sin(dVar10);
      dVar9 = dVar9 * dVar1 * delta_t;
      dVar7 = dVar7 * dVar1 * delta_t;
    }
    else {
      dVar11 = dVar2 * delta_t + dVar10;
      dVar7 = sin(dVar11);
      dVar8 = sin(dVar10);
      dVar9 = cos(dVar10);
      dVar11 = cos(dVar11);
      dVar9 = (dVar1 / dVar2) * (dVar9 - dVar11);
      dVar7 = (dVar1 / dVar2) * (dVar7 - dVar8);
    }
    local_88 = dVar2 * delta_t + dVar10;
    dStack_d0 = dStack_d0 + dVar7;
    local_d8 = local_d8 + dVar9;
    dVar9 = dVar3 * 0.5 * delta_t * delta_t;
    dVar7 = cos(dVar10);
    dVar10 = sin(dVar10);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,0,
                        col);
    *pSVar6 = dVar7 * dVar9 + dStack_d0;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,1,
                        col);
    *pSVar6 = dVar10 * dVar9 + local_d8;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,2,
                        col);
    *pSVar6 = dVar3 * delta_t + dVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,3,
                        col);
    *pSVar6 = dVar4 * 0.5 * delta_t * delta_t + local_88;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)Xsig_pred,4,
                        col);
    *pSVar6 = dVar4 * delta_t + dVar2;
  }
  return;
}

Assistant:

void UKF::SigmaPointPrediction(double delta_t, const MatrixXd &Xsig_aug, MatrixXd &Xsig_pred) {

  //predict sigma points
  for (int i = 0; i < n_sigma_; i++) {

    //extract values for better readability
    double p_x = Xsig_aug(0, i);
    double p_y = Xsig_aug(1, i);
    double v = Xsig_aug(2, i);
    double yaw = Xsig_aug(3, i);
    double yawd = Xsig_aug(4, i);
    double nu_a = Xsig_aug(5, i);
    double nu_yawdd = Xsig_aug(6, i);

    //predicted state values
    double px_p, py_p;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v / yawd * ( sin (yaw + yawd*delta_t) - sin(yaw));
      py_p = p_y + v / yawd * ( cos(yaw) - cos(yaw+yawd*delta_t) );
    }
    else {
      px_p = p_x + v*delta_t*cos(yaw);
      py_p = p_y + v*delta_t*sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd * delta_t;
    double yawd_p = yawd;

    //add noise
    px_p = px_p + 0.5*nu_a*delta_t*delta_t * cos(yaw);
    py_p = py_p + 0.5*nu_a*delta_t*delta_t * sin(yaw);
    v_p = v_p + nu_a*delta_t;

    yaw_p = yaw_p + 0.5 * nu_yawdd * delta_t * delta_t;
    yawd_p = yawd_p + nu_yawdd * delta_t;

    //write predicted sigma point into right column
    Xsig_pred(0,i) = px_p;
    Xsig_pred(1,i) = py_p;
    Xsig_pred(2,i) = v_p;
    Xsig_pred(3,i) = yaw_p;
    Xsig_pred(4,i) = yawd_p;
  }
}